

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O1

bool isItAFunction<GeneralHash<1,unsigned_int,unsigned_char>>(uint L)

{
  byte outchar;
  uint uVar1;
  uint32 uVar2;
  ostream *poVar3;
  ulong uVar4;
  byte *pbVar5;
  uint uVar6;
  byte inchar;
  uint j;
  int iVar7;
  byte *pbVar8;
  long lVar9;
  ulong uVar10;
  _Map_pointer ppuVar11;
  bool bVar12;
  uchar c;
  deque<unsigned_char,_std::allocator<unsigned_char>_> s;
  GeneralHash<1,_unsigned_int,_unsigned_char> hf;
  mersenneRNG generator;
  byte local_1861;
  uint32 local_1860;
  _Deque_base<unsigned_char,_std::allocator<unsigned_char>_> local_1858;
  uint local_17fc;
  GeneralHash<1,_unsigned_int,_unsigned_char> local_17f8;
  MTRand local_13c8;
  int local_38;
  
  MTRand::seed(&local_13c8);
  local_38 = 5;
  iVar7 = 3;
  GeneralHash<1,_unsigned_int,_unsigned_char>::GeneralHash(&local_17f8,3,L);
  local_1858._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_1858._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_1858._M_impl.super__Deque_impl_data._M_finish._M_cur = (byte *)0x0;
  local_1858._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_1858._M_impl.super__Deque_impl_data._M_start._M_last = (byte *)0x0;
  local_1858._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_1858._M_impl.super__Deque_impl_data._M_start._M_cur = (byte *)0x0;
  local_1858._M_impl.super__Deque_impl_data._M_start._M_first = (byte *)0x0;
  local_1858._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_1858._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_initialize_map(&local_1858,0);
  do {
    local_1860 = (uint32)local_38;
    uVar2 = MTRand::randInt(&local_13c8,&local_1860);
    local_1861 = (char)uVar2 + 0x41;
    if (local_1858._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_1858._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<unsigned_char,std::allocator<unsigned_char>>::
      _M_push_back_aux<unsigned_char_const&>
                ((deque<unsigned_char,std::allocator<unsigned_char>> *)&local_1858,&local_1861);
    }
    else {
      *local_1858._M_impl.super__Deque_impl_data._M_finish._M_cur = local_1861;
      local_1858._M_impl.super__Deque_impl_data._M_finish._M_cur =
           local_1858._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
    }
    uVar6 = 0;
    if ((local_17f8.lastbit & ~(local_17f8.hashvalue * 2)) == 0) {
      uVar6 = local_17f8.irreduciblepoly;
    }
    local_17f8.hashvalue =
         uVar6 ^ local_17f8.hashvalue * 2 ^ local_17f8.hasher.hashvalues[local_1861];
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  uVar4 = 0;
  uVar6 = 0;
  while( true ) {
    outchar = *local_1858._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_17fc = (uint)uVar4;
    if (local_1858._M_impl.super__Deque_impl_data._M_start._M_cur ==
        local_1858._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
      operator_delete(local_1858._M_impl.super__Deque_impl_data._M_start._M_first);
      local_1858._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_1858._M_impl.super__Deque_impl_data._M_start._M_node[1];
      local_1858._M_impl.super__Deque_impl_data._M_start._M_last =
           local_1858._M_impl.super__Deque_impl_data._M_start._M_cur + 0x200;
      local_1858._M_impl.super__Deque_impl_data._M_start._M_first =
           local_1858._M_impl.super__Deque_impl_data._M_start._M_cur;
      local_1858._M_impl.super__Deque_impl_data._M_start._M_node =
           local_1858._M_impl.super__Deque_impl_data._M_start._M_node + 1;
    }
    else {
      local_1858._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_1858._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
    }
    local_1860 = (uint32)local_38;
    uVar2 = MTRand::randInt(&local_13c8,&local_1860);
    inchar = (char)uVar2 + 0x41;
    local_1860 = CONCAT71(local_1860._1_7_,inchar);
    if (local_1858._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_1858._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<unsigned_char,_std::allocator<unsigned_char>_>::_M_push_back_aux<unsigned_char>
                ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1858,
                 (uchar *)&local_1860);
    }
    else {
      *local_1858._M_impl.super__Deque_impl_data._M_finish._M_cur = inchar;
      local_1858._M_impl.super__Deque_impl_data._M_finish._M_cur =
           local_1858._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
    }
    GeneralHash<1,_unsigned_int,_unsigned_char>::update(&local_17f8,outchar,inchar);
    uVar1 = GeneralHash<1,unsigned_int,unsigned_char>::
            hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
                      ((GeneralHash<1,unsigned_int,unsigned_char> *)&local_17f8,
                       (deque<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1858);
    if (uVar1 != local_17f8.hashvalue) break;
    bVar12 = 0x1869e < uVar6;
    uVar6 = uVar6 + 1;
    uVar4 = CONCAT71((int7)(uVar2 >> 8),bVar12);
    if (uVar6 == 100000) goto LAB_001082a9;
  }
  pbVar8 = local_1858._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppuVar11 = local_1858._M_impl.super__Deque_impl_data._M_start._M_node;
  pbVar5 = local_1858._M_impl.super__Deque_impl_data._M_start._M_last;
  if (local_1858._M_impl.super__Deque_impl_data._M_start._M_cur !=
      local_1858._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    do {
      local_1860 = CONCAT71(local_1860._1_7_,*pbVar8);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)&local_1860,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      pbVar8 = pbVar8 + 1;
      if (pbVar8 == pbVar5) {
        pbVar8 = ppuVar11[1];
        ppuVar11 = ppuVar11 + 1;
        pbVar5 = pbVar8 + 0x200;
      }
    } while (pbVar8 != local_1858._M_impl.super__Deque_impl_data._M_finish._M_cur);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"bug",3);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  uVar4 = (long)local_1858._M_impl.super__Deque_impl_data._M_start._M_cur -
          (long)local_1858._M_impl.super__Deque_impl_data._M_start._M_first;
  pbVar5 = local_1858._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (0x1ff < uVar4) {
    uVar10 = uVar4 >> 9 | 0xff80000000000000;
    if (0 < (long)uVar4) {
      uVar10 = uVar4 >> 9;
    }
    pbVar5 = local_1858._M_impl.super__Deque_impl_data._M_start._M_node[uVar10] +
             uVar4 + uVar10 * -0x200;
  }
  local_1860._0_1_ = *pbVar5;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)&local_1860,1);
  pbVar5 = local_1858._M_impl.super__Deque_impl_data._M_start._M_cur +
           (1 - (long)local_1858._M_impl.super__Deque_impl_data._M_start._M_first);
  if (pbVar5 < (byte *)0x200) {
    pbVar5 = local_1858._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
  }
  else {
    uVar4 = (ulong)pbVar5 >> 9 | 0xff80000000000000;
    if (-1 < (long)local_1858._M_impl.super__Deque_impl_data._M_start._M_cur -
             (long)local_1858._M_impl.super__Deque_impl_data._M_start._M_first) {
      uVar4 = (ulong)pbVar5 >> 9;
    }
    pbVar5 = local_1858._M_impl.super__Deque_impl_data._M_start._M_node[uVar4] +
             (long)(pbVar5 + uVar4 * -0x200);
  }
  local_1860._0_1_ = *pbVar5;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_1860,1);
  pbVar5 = local_1858._M_impl.super__Deque_impl_data._M_start._M_cur +
           (2 - (long)local_1858._M_impl.super__Deque_impl_data._M_start._M_first);
  if (pbVar5 < (byte *)0x200) {
    pbVar5 = local_1858._M_impl.super__Deque_impl_data._M_start._M_cur + 2;
  }
  else {
    uVar4 = (ulong)pbVar5 >> 9 | 0xff80000000000000;
    if (-2 < (long)local_1858._M_impl.super__Deque_impl_data._M_start._M_cur -
             (long)local_1858._M_impl.super__Deque_impl_data._M_start._M_first) {
      uVar4 = (ulong)pbVar5 >> 9;
    }
    pbVar5 = local_1858._M_impl.super__Deque_impl_data._M_start._M_node[uVar4] +
             (long)(pbVar5 + uVar4 * -0x200);
  }
  local_1860 = CONCAT71(local_1860._1_7_,*pbVar5);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_1860,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," was hashed to ",0xf);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," when true hash value is ",0x19);
  GeneralHash<1,unsigned_int,unsigned_char>::
  hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
            ((GeneralHash<1,unsigned_int,unsigned_char> *)&local_17f8,
             (deque<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1858);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  lVar9 = 0;
  do {
    pbVar5 = local_1858._M_impl.super__Deque_impl_data._M_start._M_cur +
             (lVar9 - (long)local_1858._M_impl.super__Deque_impl_data._M_start._M_first);
    pbVar8 = local_1858._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((byte *)0x1ff < pbVar5) {
      uVar4 = (ulong)pbVar5 >> 9 | 0xff80000000000000;
      if (0 < (long)pbVar5) {
        uVar4 = (ulong)pbVar5 >> 9;
      }
      pbVar8 = local_1858._M_impl.super__Deque_impl_data._M_start._M_node[uVar4] +
               (long)(local_1858._M_impl.super__Deque_impl_data._M_start._M_cur +
                     (uVar4 * -0x200 -
                     (long)local_1858._M_impl.super__Deque_impl_data._M_start._M_first));
    }
    local_1860 = CONCAT71(local_1860._1_7_,pbVar8[lVar9]);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)&local_1860,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"->",2);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  uVar4 = (ulong)local_17fc;
LAB_001082a9:
  std::_Deque_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Deque_base(&local_1858);
  if (local_17f8.precomputedshift.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_17f8.precomputedshift.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return (bool)((byte)uVar4 & 1);
}

Assistant:

bool isItAFunction(uint L = 7) {
  mersenneRNG generator(5);
  const uint n(3); // n-grams
  hashfunction hf(n, L);
  deque<unsigned char> s;
  for (uint32 k = 0; k < n; ++k) {
    unsigned char c = static_cast<unsigned char>(generator() + 65);
    s.push_back(c);
    hf.eat(c);
  }
  for (uint32 k = 0; k < 100000; ++k) {
    unsigned char out = s.front();
    s.pop_front();
    char c(generator() + 65);

    s.push_back(c);
    hf.update(out, c);
    if (hf.hash(s) != hf.hashvalue) {
      for (deque<unsigned char>::iterator ii = s.begin(); ii != s.end(); ++ii)
        cout << *ii << " " << static_cast<uint32>(*ii) << endl;
      cerr << "bug" << endl;
      cerr << s[0] << s[1] << s[2] << " was hashed to " << hf.hashvalue
           << " when true hash value is " << hf.hash(s) << endl;
      for (uint j = 0; j < n; ++j)
        cerr << s[j] << "->" << hf.hasher.hashvalues[s[j]] << endl;
      return false;
    }
  }
  return true;
}